

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::add_sub<false,true,unsigned_char>
               (uchar source,uchar *destination,Status *status)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar1 = *destination;
  bVar2 = bVar1 - source;
  uVar3 = (ulong)(bVar1 < source);
  status->carry_flag = uVar3;
  if (status->extend_flag != 0) {
    bVar4 = bVar2 == 0;
    bVar2 = bVar2 - 1;
    uVar3 = (ulong)(bVar4 || bVar1 < source);
    status->carry_flag = uVar3;
  }
  status->extend_flag = uVar3;
  status->zero_result = status->zero_result | (ulong)bVar2;
  status->negative_flag = (ulong)(bVar2 & 0x80);
  status->overflow_flag = (ulong)((source ^ *destination) & (*destination ^ bVar2) & 0x80);
  *destination = bVar2;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}